

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

bool __thiscall
Rml::DataInterpreter::Execute
          (DataInterpreter *this,Instruction instruction,Variant *data,size_t *next_instruction)

{
  String *__return_storage_ptr__;
  pointer *default_value;
  vector<Rml::Variant,_std::allocator<Rml::Variant>_> *this_00;
  code *pcVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  reference pvVar6;
  size_type sVar7;
  const_reference pvVar8;
  char *pcVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  unsigned_long uVar12;
  double dVar13;
  double dVar14;
  bool local_8ba;
  bool local_832;
  bool local_831;
  allocator<char> local_789;
  String local_788;
  int local_768;
  allocator<char> local_761;
  int tmp;
  allocator<char> local_739;
  String local_738;
  size_type local_718;
  size_t variable_index_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  ulong local_6b0;
  size_t i;
  String arguments_str;
  undefined1 local_680 [7];
  bool result;
  undefined1 local_660 [8];
  String function_name;
  Vector<Variant> arguments;
  int num_arguments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  bool local_571;
  Variant local_570;
  bool local_541;
  Variant local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  bool local_491;
  Variant local_490;
  bool local_461;
  Variant local_460;
  bool local_431;
  Variant local_430;
  bool local_401;
  Variant local_400;
  bool local_3d1;
  Variant local_3d0;
  bool local_3a1;
  Variant local_3a0;
  bool local_371;
  Variant local_370;
  bool local_341;
  Variant local_340;
  double local_318;
  Variant local_310;
  double local_2e8;
  Variant local_2e0;
  double local_2b8;
  Variant local_2b0;
  double local_288;
  Variant local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  Variant local_1b8;
  allocator<char> local_189;
  String local_188;
  Variant local_168;
  size_type local_140;
  size_t variable_index;
  uint local_110;
  allocator<char> local_109;
  String local_108;
  undefined1 local_e8 [8];
  DataAddress address;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  Register reg;
  allocator<char> local_59;
  String local_58;
  anon_class_1_0_00000001 local_31;
  size_t *psStack_30;
  anon_class_1_0_00000001 AnyString;
  size_t *next_instruction_local;
  Variant *data_local;
  Instruction instruction_local;
  DataInterpreter *this_local;
  
  psStack_30 = next_instruction;
  switch(instruction) {
  case Not:
    bVar3 = Variant::Get<bool>(&this->R,false);
    local_341 = (bool)((bVar3 ^ 0xffU) & 1);
    Variant::Variant<bool,void>(&local_340,&local_341);
    Variant::operator=(&this->R,&local_340);
    Variant::~Variant(&local_340);
    break;
  default:
    bVar3 = Assert("Instruction not implemented.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataExpression.cpp"
                   ,0x465);
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    break;
  case NumArguments:
    arguments.super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = Variant::Get<int>(data,-1);
    Variant::operator=(&this->R,(int *)&arguments.
                                        super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    break;
  case And:
    bVar3 = Variant::Get<bool>(&this->L,false);
    local_831 = false;
    if (bVar3) {
      local_831 = Variant::Get<bool>(&this->R,false);
    }
    local_371 = local_831;
    Variant::Variant<bool,void>(&local_370,&local_371);
    Variant::operator=(&this->R,&local_370);
    Variant::~Variant(&local_370);
    break;
  case Multiply:
    dVar13 = Variant::Get<double>(&this->L,0.0);
    local_2e8 = Variant::Get<double>(&this->R,0.0);
    local_2e8 = dVar13 * local_2e8;
    Variant::Variant<double,void>(&local_2e0,&local_2e8);
    Variant::operator=(&this->R,&local_2e0);
    Variant::~Variant(&local_2e0);
    break;
  case Add:
    bVar3 = Execute::anon_class_1_0_00000001::operator()(&local_31,&this->L,&this->R);
    if (bVar3) {
      ::std::__cxx11::string::string((string *)&local_218);
      Variant::Get<std::__cxx11::string>(&local_1f8,&this->L,&local_218);
      ::std::__cxx11::string::string((string *)&local_258);
      Variant::Get<std::__cxx11::string>(&local_238,&this->R,&local_258);
      ::std::operator+(&local_1d8,&local_1f8,&local_238);
      Variant::Variant<std::__cxx11::string,void>(&local_1b8,&local_1d8);
      Variant::operator=(&this->R,&local_1b8);
      Variant::~Variant(&local_1b8);
      ::std::__cxx11::string::~string((string *)&local_1d8);
      ::std::__cxx11::string::~string((string *)&local_238);
      ::std::__cxx11::string::~string((string *)&local_258);
      ::std::__cxx11::string::~string((string *)&local_1f8);
      ::std::__cxx11::string::~string((string *)&local_218);
    }
    else {
      dVar13 = Variant::Get<double>(&this->L,0.0);
      local_288 = Variant::Get<double>(&this->R,0.0);
      local_288 = dVar13 + local_288;
      Variant::Variant<double,void>(&local_280,&local_288);
      Variant::operator=(&this->R,&local_280);
      Variant::~Variant(&local_280);
    }
    break;
  case Subtract:
    dVar13 = Variant::Get<double>(&this->L,0.0);
    local_2b8 = Variant::Get<double>(&this->R,0.0);
    local_2b8 = dVar13 - local_2b8;
    Variant::Variant<double,void>(&local_2b0,&local_2b8);
    Variant::operator=(&this->R,&local_2b0);
    Variant::~Variant(&local_2b0);
    break;
  case Divide:
    dVar13 = Variant::Get<double>(&this->L,0.0);
    local_318 = Variant::Get<double>(&this->R,0.0);
    local_318 = dVar13 / local_318;
    Variant::Variant<double,void>(&local_310,&local_318);
    Variant::operator=(&this->R,&local_310);
    Variant::~Variant(&local_310);
    break;
  case Less:
    dVar13 = Variant::Get<double>(&this->L,0.0);
    dVar14 = Variant::Get<double>(&this->R,0.0);
    local_3d1 = dVar13 < dVar14;
    Variant::Variant<bool,void>(&local_3d0,&local_3d1);
    Variant::operator=(&this->R,&local_3d0);
    Variant::~Variant(&local_3d0);
    break;
  case Equal:
    bVar3 = Execute::anon_class_1_0_00000001::operator()(&local_31,&this->L,&this->R);
    if (bVar3) {
      ::std::__cxx11::string::string((string *)&local_4d8);
      Variant::Get<std::__cxx11::string>(&local_4b8,&this->L,&local_4d8);
      ::std::__cxx11::string::string((string *)&local_518);
      Variant::Get<std::__cxx11::string>(&local_4f8,&this->R,&local_518);
      local_491 = ::std::operator==(&local_4b8,&local_4f8);
      Variant::Variant<bool,void>(&local_490,&local_491);
      Variant::operator=(&this->R,&local_490);
      Variant::~Variant(&local_490);
      ::std::__cxx11::string::~string((string *)&local_4f8);
      ::std::__cxx11::string::~string((string *)&local_518);
      ::std::__cxx11::string::~string((string *)&local_4b8);
      ::std::__cxx11::string::~string((string *)&local_4d8);
    }
    else {
      dVar13 = Variant::Get<double>(&this->L,0.0);
      dVar14 = Variant::Get<double>(&this->R,0.0);
      local_541 = dVar13 == dVar14;
      Variant::Variant<bool,void>(&local_540,&local_541);
      Variant::operator=(&this->R,&local_540);
      Variant::~Variant(&local_540);
    }
    break;
  case Greater:
    dVar13 = Variant::Get<double>(&this->L,0.0);
    dVar14 = Variant::Get<double>(&this->R,0.0);
    local_431 = dVar14 < dVar13;
    Variant::Variant<bool,void>(&local_430,&local_431);
    Variant::operator=(&this->R,&local_430);
    Variant::~Variant(&local_430);
    break;
  case Assign:
    iVar5 = Variant::Get<int>(data,-1);
    local_718 = (long)iVar5;
    sVar7 = ::std::
            vector<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
            ::size(this->addresses);
    if (sVar7 <= (ulong)(long)iVar5) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tmp,"Variable address not found.",&local_761);
      this_local._7_1_ = Error(this,(String *)&tmp);
      ::std::__cxx11::string::~string((string *)&tmp);
      ::std::allocator<char>::~allocator(&local_761);
      goto LAB_004f3ce1;
    }
    pvVar8 = ::std::
             vector<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
             ::operator[](this->addresses,local_718);
    bVar3 = DataExpressionInterface::SetValue(&this->expression_interface,pvVar8,&this->R);
    if (!bVar3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_738,"Could not assign to variable.",&local_739);
      this_local._7_1_ = Error(this,&local_738);
      ::std::__cxx11::string::~string((string *)&local_738);
      ::std::allocator<char>::~allocator(&local_739);
      goto LAB_004f3ce1;
    }
    break;
  case Literal:
    Variant::operator=(&this->R,data);
    break;
  case EventFnc:
  case TransformFnc:
    this_00 = (vector<Rml::Variant,_std::allocator<Rml::Variant>_> *)
              ((long)&function_name.field_2 + 8);
    ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::vector(this_00);
    bVar3 = ExtractArgumentsFromStack(this,this_00);
    if (bVar3) {
      ::std::__cxx11::string::string((string *)local_680);
      Variant::Get<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_660,data
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_680);
      ::std::__cxx11::string::~string((string *)local_680);
      if (instruction == TransformFnc) {
        local_8ba = DataExpressionInterface::CallTransform
                              (&this->expression_interface,(String *)local_660,
                               (VariantList *)((long)&function_name.field_2 + 8),&this->R);
      }
      else {
        local_8ba = DataExpressionInterface::EventCallback
                              (&this->expression_interface,(String *)local_660,
                               (VariantList *)((long)&function_name.field_2 + 8));
      }
      arguments_str.field_2._M_local_buf[0xf] = local_8ba;
      if (local_8ba == false) {
        ::std::__cxx11::string::string((string *)&i);
        for (local_6b0 = 0; uVar2 = local_6b0,
            sVar7 = ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::size
                              ((vector<Rml::Variant,_std::allocator<Rml::Variant>_> *)
                               ((long)&function_name.field_2 + 8)), uVar2 < sVar7;
            local_6b0 = local_6b0 + 1) {
          pvVar6 = ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::operator[]
                             ((vector<Rml::Variant,_std::allocator<Rml::Variant>_> *)
                              ((long)&function_name.field_2 + 8),local_6b0);
          ::std::__cxx11::string::string((string *)&local_6f0);
          Variant::Get<std::__cxx11::string>(&local_6d0,pvVar6,&local_6f0);
          ::std::__cxx11::string::operator+=((string *)&i,(string *)&local_6d0);
          ::std::__cxx11::string::~string((string *)&local_6d0);
          ::std::__cxx11::string::~string((string *)&local_6f0);
          uVar2 = local_6b0;
          sVar7 = ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::size
                            ((vector<Rml::Variant,_std::allocator<Rml::Variant>_> *)
                             ((long)&function_name.field_2 + 8));
          if (uVar2 < sVar7 - 1) {
            ::std::__cxx11::string::operator+=((string *)&i,", ");
          }
        }
        pcVar9 = "event callback";
        if (instruction == TransformFnc) {
          pcVar9 = "transform function";
        }
        uVar10 = ::std::__cxx11::string::c_str();
        uVar11 = ::std::__cxx11::string::c_str();
        CreateString_abi_cxx11_
                  ((String *)&variable_index_1,"Failed to execute %s: %s(%s)",pcVar9,uVar10,uVar11);
        this_local._7_1_ = Error(this,(String *)&variable_index_1);
        ::std::__cxx11::string::~string((string *)&variable_index_1);
        local_110 = 1;
        ::std::__cxx11::string::~string((string *)&i);
      }
      else {
        local_110 = 0;
      }
      ::std::__cxx11::string::~string((string *)local_660);
    }
    else {
      this_local._7_1_ = 0;
      local_110 = 1;
    }
    ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::~vector
              ((vector<Rml::Variant,_std::allocator<Rml::Variant>_> *)
               ((long)&function_name.field_2 + 8));
    goto joined_r0x004f2992;
  case GreaterEq:
    dVar13 = Variant::Get<double>(&this->L,0.0);
    dVar14 = Variant::Get<double>(&this->R,0.0);
    local_461 = dVar14 <= dVar13;
    Variant::Variant<bool,void>(&local_460,&local_461);
    Variant::operator=(&this->R,&local_460);
    Variant::~Variant(&local_460);
    break;
  case CastToInt:
    bVar3 = Variant::GetInto<int,_0>(&this->R,&local_768);
    if (!bVar3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_788,"Could not cast value to int.",&local_789);
      this_local._7_1_ = Error(this,&local_788);
      ::std::__cxx11::string::~string((string *)&local_788);
      ::std::allocator<char>::~allocator(&local_789);
      goto LAB_004f3ce1;
    }
    Variant::operator=(&this->R,&local_768);
    break;
  case Jump:
    uVar12 = Variant::Get<unsigned_long>(data,0);
    *psStack_30 = uVar12;
    break;
  case LessEq:
    dVar13 = Variant::Get<double>(&this->L,0.0);
    dVar14 = Variant::Get<double>(&this->R,0.0);
    local_401 = dVar13 <= dVar14;
    Variant::Variant<bool,void>(&local_400,&local_401);
    Variant::operator=(&this->R,&local_400);
    Variant::~Variant(&local_400);
    break;
  case NotEqual:
    bVar3 = Execute::anon_class_1_0_00000001::operator()(&local_31,&this->L,&this->R);
    if (bVar3) {
      ::std::__cxx11::string::string((string *)&local_5b8);
      Variant::Get<std::__cxx11::string>(&local_598,&this->L,&local_5b8);
      ::std::__cxx11::string::string((string *)&local_5f8);
      Variant::Get<std::__cxx11::string>(&local_5d8,&this->R,&local_5f8);
      local_571 = ::std::operator!=(&local_598,&local_5d8);
      Variant::Variant<bool,void>(&local_570,&local_571);
      Variant::operator=(&this->R,&local_570);
      Variant::~Variant(&local_570);
      ::std::__cxx11::string::~string((string *)&local_5d8);
      ::std::__cxx11::string::~string((string *)&local_5f8);
      ::std::__cxx11::string::~string((string *)&local_598);
      ::std::__cxx11::string::~string((string *)&local_5b8);
    }
    else {
      dVar13 = Variant::Get<double>(&this->L,0.0);
      dVar14 = Variant::Get<double>(&this->R,0.0);
      arguments.super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = dVar13 != dVar14;
      Variant::Variant<bool,void>
                ((Variant *)&num_arguments,
                 (bool *)((long)&arguments.
                                 super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      Variant::operator=(&this->R,(Variant *)&num_arguments);
      Variant::~Variant((Variant *)&num_arguments);
    }
    break;
  case Push:
    ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::push_back(&this->stack,&this->R);
    Variant::Clear(&this->R);
    break;
  case Variable:
    iVar5 = Variant::Get<int>(data,-1);
    local_140 = (long)iVar5;
    sVar7 = ::std::
            vector<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
            ::size(this->addresses);
    if (sVar7 <= (ulong)(long)iVar5) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,"Variable address not found.",&local_189);
      this_local._7_1_ = Error(this,&local_188);
      ::std::__cxx11::string::~string((string *)&local_188);
      ::std::allocator<char>::~allocator(&local_189);
      goto LAB_004f3ce1;
    }
    pvVar8 = ::std::
             vector<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
             ::operator[](this->addresses,local_140);
    DataExpressionInterface::GetValue(&local_168,&this->expression_interface,pvVar8);
    Variant::operator=(&this->R,&local_168);
    Variant::~Variant(&local_168);
    break;
  case DynamicVariable:
    default_value =
         &address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
    ::std::__cxx11::string::string((string *)default_value);
    Variant::Get<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
               &this->R,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        default_value);
    ::std::__cxx11::string::~string
              ((string *)
               &address.
                super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    DataExpressionInterface::ParseAddress
              ((DataAddress *)local_e8,&this->expression_interface,(String *)local_b0);
    bVar3 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::empty
                      ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)
                       local_e8);
    if (bVar3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Variable address not found.",&local_109);
      this_local._7_1_ = Error(this,&local_108);
      ::std::__cxx11::string::~string((string *)&local_108);
      ::std::allocator<char>::~allocator(&local_109);
    }
    else {
      DataExpressionInterface::GetValue
                ((Variant *)&variable_index,&this->expression_interface,(DataAddress *)local_e8);
      Variant::operator=(&this->R,(Variant *)&variable_index);
      Variant::~Variant((Variant *)&variable_index);
    }
    local_110 = (uint)bVar3;
    ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector
              ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)local_e8);
    ::std::__cxx11::string::~string((string *)local_b0);
joined_r0x004f2992:
    if (local_110 != 0) goto LAB_004f3ce1;
    break;
  case JumpIfZero:
    bVar3 = Variant::Get<bool>(&this->R,false);
    if (!bVar3) {
      uVar12 = Variant::Get<unsigned_long>(data,0);
      *psStack_30 = uVar12;
    }
    break;
  case Pop:
    bVar3 = ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::empty(&this->stack);
    if (bVar3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Cannot pop stack, it is empty.",&local_59);
      this_local._7_1_ = Error(this,&local_58);
      ::std::__cxx11::string::~string((string *)&local_58);
      ::std::allocator<char>::~allocator(&local_59);
      goto LAB_004f3ce1;
    }
    uVar4 = Variant::Get<int>(data,-1);
    if (uVar4 == 0) {
      pvVar6 = ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::back(&this->stack);
      Variant::operator=(&this->R,pvVar6);
      ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::pop_back(&this->stack);
    }
    else {
      if (uVar4 != 1) {
        __return_storage_ptr__ = (String *)((long)&str.field_2 + 8);
        CreateString_abi_cxx11_(__return_storage_ptr__,"Invalid register %d.",(ulong)uVar4);
        this_local._7_1_ = Error(this,__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)(str.field_2._M_local_buf + 8));
        goto LAB_004f3ce1;
      }
      pvVar6 = ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::back(&this->stack);
      Variant::operator=(&this->L,pvVar6);
      ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::pop_back(&this->stack);
    }
    break;
  case Or:
    bVar3 = Variant::Get<bool>(&this->L,false);
    local_832 = true;
    if (!bVar3) {
      local_832 = Variant::Get<bool>(&this->R,false);
    }
    local_3a1 = local_832;
    Variant::Variant<bool,void>(&local_3a0,&local_3a1);
    Variant::operator=(&this->R,&local_3a0);
    Variant::~Variant(&local_3a0);
  }
  this_local._7_1_ = 1;
LAB_004f3ce1:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Execute(const Instruction instruction, const Variant& data, size_t& next_instruction)
	{
		auto AnyString = [](const Variant& v1, const Variant& v2) { return v1.GetType() == Variant::STRING || v2.GetType() == Variant::STRING; };

		switch (instruction)
		{
		case Instruction::Push:
		{
			stack.push_back(std::move(R));
			R.Clear();
		}
		break;
		case Instruction::Pop:
		{
			if (stack.empty())
				return Error("Cannot pop stack, it is empty.");

			Register reg = Register(data.Get<int>(-1));
			switch (reg)
			{
				// clang-format off
			case Register::R:  R = stack.back(); stack.pop_back(); break;
			case Register::L:  L = stack.back(); stack.pop_back(); break;
				// clang-format on
			default: return Error(CreateString("Invalid register %d.", int(reg)));
			}
		}
		break;
		case Instruction::Literal:
		{
			R = data;
		}
		break;
		case Instruction::DynamicVariable:
		{
			auto str = R.Get<String>();
			auto address = expression_interface.ParseAddress(str);
			if (address.empty())
				return Error("Variable address not found.");
			R = expression_interface.GetValue(address);
		}
		break;
		case Instruction::Variable:
		{
			size_t variable_index = size_t(data.Get<int>(-1));
			if (variable_index < addresses.size())
				R = expression_interface.GetValue(addresses[variable_index]);
			else
				return Error("Variable address not found.");
		}
		break;
		case Instruction::Add:
		{
			if (AnyString(L, R))
				R = Variant(L.Get<String>() + R.Get<String>());
			else
				R = Variant(L.Get<double>() + R.Get<double>());
		}
		break;
			// clang-format off
		case Instruction::Subtract:  R = Variant(L.Get<double>() - R.Get<double>());  break;
		case Instruction::Multiply:  R = Variant(L.Get<double>() * R.Get<double>());  break;
		case Instruction::Divide:    R = Variant(L.Get<double>() / R.Get<double>());  break;
		case Instruction::Not:       R = Variant(!R.Get<bool>());                     break;
		case Instruction::And:       R = Variant(L.Get<bool>() && R.Get<bool>());     break;
		case Instruction::Or:        R = Variant(L.Get<bool>() || R.Get<bool>());     break;
		case Instruction::Less:      R = Variant(L.Get<double>() < R.Get<double>());  break;
		case Instruction::LessEq:    R = Variant(L.Get<double>() <= R.Get<double>()); break;
		case Instruction::Greater:   R = Variant(L.Get<double>() > R.Get<double>());  break;
		case Instruction::GreaterEq: R = Variant(L.Get<double>() >= R.Get<double>()); break;
			// clang-format on
		case Instruction::Equal:
		{
			if (AnyString(L, R))
				R = Variant(L.Get<String>() == R.Get<String>());
			else
				R = Variant(L.Get<double>() == R.Get<double>());
		}
		break;
		case Instruction::NotEqual:
		{
			if (AnyString(L, R))
				R = Variant(L.Get<String>() != R.Get<String>());
			else
				R = Variant(L.Get<double>() != R.Get<double>());
		}
		break;
		case Instruction::NumArguments:
		{
			const int num_arguments = data.Get<int>(-1);
			R = num_arguments;
		}
		break;
		case Instruction::TransformFnc:
		case Instruction::EventFnc:
		{
			Vector<Variant> arguments;
			if (!ExtractArgumentsFromStack(arguments))
				return false;

			const String function_name = data.Get<String>();
			const bool result = (instruction == Instruction::TransformFnc ? expression_interface.CallTransform(function_name, arguments, R)
																		  : expression_interface.EventCallback(function_name, arguments));
			if (!result)
			{
				String arguments_str;
				for (size_t i = 0; i < arguments.size(); i++)
				{
					arguments_str += arguments[i].Get<String>();
					if (i < arguments.size() - 1)
						arguments_str += ", ";
				}
				return Error(
					CreateString("Failed to execute %s: %s(%s)", instruction == Instruction::TransformFnc ? "transform function" : "event callback",
						function_name.c_str(), arguments_str.c_str()));
			}
		}
		break;
		case Instruction::Assign:
		{
			size_t variable_index = size_t(data.Get<int>(-1));
			if (variable_index < addresses.size())
			{
				if (!expression_interface.SetValue(addresses[variable_index], R))
					return Error("Could not assign to variable.");
			}
			else
				return Error("Variable address not found.");
		}
		break;
		case Instruction::CastToInt:
		{
			int tmp;
			if (!R.GetInto(tmp))
				return Error("Could not cast value to int.");
			else
				R = tmp;
		}
		break;
		case Instruction::JumpIfZero:
		{
			if (!R.Get<bool>())
				next_instruction = data.Get<size_t>(0);
		}
		break;
		case Instruction::Jump:
		{
			next_instruction = data.Get<size_t>(0);
		}
		break;
		default: RMLUI_ERRORMSG("Instruction not implemented."); break;
		}
		return true;
	}